

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_msl.cpp
# Opt level: O3

SPVFuncImpl __thiscall
spirv_cross::CompilerMSL::OpCodePreprocessor::get_spv_func_impl
          (OpCodePreprocessor *this,Op opcode,uint32_t *args)

{
  uint uVar1;
  uint32_t uVar2;
  bool bVar3;
  iterator iVar4;
  SPIRVariable *pSVar5;
  ulong uVar6;
  SPIRType *pSVar7;
  mapped_type *pmVar8;
  SPIRExtension *pSVar9;
  SPVFuncImpl SVar10;
  
  if ((int)opcode < 0x150) {
    if ((int)opcode < 0xe3) {
      if (0x73 < (int)opcode) {
        uVar1 = opcode - OpFAdd;
        if (uVar1 < 0x13) {
          if ((0x78010U >> (uVar1 & 0x1f) & 1) != 0) {
            if ((this->compiler->msl_options).invariant_float_math != false) {
              return SPVFuncImplFMul;
            }
            bVar3 = Compiler::has_decoration
                              ((Compiler *)this->compiler,(ID)args[1],DecorationNoContraction);
            if (!bVar3) {
              return SPVFuncImplNone;
            }
            return SPVFuncImplFMul;
          }
          if ((5U >> (uVar1 & 0x1f) & 1) != 0) {
            if (((this->compiler->msl_options).invariant_float_math == false) &&
               (bVar3 = Compiler::has_decoration
                                  ((Compiler *)this->compiler,(ID)args[1],DecorationNoContraction),
               !bVar3)) {
              return SPVFuncImplNone;
            }
            return opcode == OpFAdd ^ SPVFuncImplFSub;
          }
          if (uVar1 == 0xc) {
            return SPVFuncImplMod;
          }
        }
        if (opcode != OpQuantizeToF16) {
          return SPVFuncImplNone;
        }
        return SPVFuncImplQuantizeToF16;
      }
      if ((int)opcode < 0x62) {
        if (opcode == OpExtInst) {
          pSVar9 = Variant::get<spirv_cross::SPIRExtension>
                             ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                              super_VectorView<spirv_cross::Variant>.ptr + args[2]);
          if (*(int *)&(pSVar9->super_IVariant).field_0xc != 1) {
            return SPVFuncImplNone;
          }
          uVar2 = args[3];
          if ((int)uVar2 < 0x22) {
            if (uVar2 == 7) {
              return SPVFuncImplSSign;
            }
            if (uVar2 != 0xb) {
              if (uVar2 != 0xc) {
                return SPVFuncImplNone;
              }
              return SPVFuncImplDegrees;
            }
            return SPVFuncImplRadians;
          }
          switch(uVar2) {
          case 0x46:
            pSVar7 = Variant::get<spirv_cross::SPIRType>
                               ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>.ptr + *args);
            SVar10 = SPVFuncImplFaceForwardScalar;
            break;
          case 0x47:
            pSVar7 = Variant::get<spirv_cross::SPIRType>
                               ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>.ptr + *args);
            SVar10 = SPVFuncImplReflectScalar;
            break;
          case 0x48:
            pSVar7 = Variant::get<spirv_cross::SPIRType>
                               ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>.ptr + *args);
            SVar10 = SPVFuncImplRefractScalar;
            break;
          case 0x49:
            return SPVFuncImplFindILsb;
          case 0x4a:
            return SPVFuncImplFindSMsb;
          case 0x4b:
            return SPVFuncImplFindUMsb;
          default:
            if (uVar2 != 0x22) {
              return SPVFuncImplNone;
            }
            pSVar7 = Variant::get<spirv_cross::SPIRType>
                               ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                                super_VectorView<spirv_cross::Variant>.ptr + *args);
            if (4 < pSVar7->columns) {
              return SPVFuncImplNone;
            }
            return (SPVFuncImpl)(0x18191a0000 >> ((byte)(pSVar7->columns << 3) & 0x3f));
          }
          if (pSVar7->vecsize != 1) {
            return SPVFuncImplNone;
          }
          return SVar10;
        }
        if (opcode == OpTypeArray) {
          return SPVFuncImplUnsafeArray;
        }
        if (opcode != OpImageFetch) {
          return SPVFuncImplNone;
        }
      }
      else if (1 < opcode - OpImageRead) {
        return SPVFuncImplNone;
      }
      pmVar8 = ::std::__detail::
               _Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->result_types,args + (ulong)(opcode != OpImageWrite) * 2);
      if ((ulong)*pmVar8 == 0) {
        return SPVFuncImplNone;
      }
      pSVar7 = Variant::get<spirv_cross::SPIRType>
                         ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                          super_VectorView<spirv_cross::Variant>.ptr + *pmVar8);
      if ((pSVar7->image).dim != DimBuffer) {
        return SPVFuncImplNone;
      }
      if ((this->compiler->msl_options).texture_buffer_native != false) {
        return SPVFuncImplNone;
      }
      return SPVFuncImplTexelBufferCoords;
    }
    if (0xf < opcode - OpAtomicLoad) {
      return SPVFuncImplNone;
    }
  }
  else {
    if ((int)opcode < 0x1145) {
      switch(opcode) {
      case OpGroupNonUniformAllEqual:
        return SPVFuncImplSubgroupAllEqual;
      case OpGroupNonUniformBroadcast:
        return SPVFuncImplSubgroupBroadcast;
      case OpGroupNonUniformBroadcastFirst:
        return SPVFuncImplSubgroupBroadcastFirst;
      case OpGroupNonUniformBallot:
        return SPVFuncImplSubgroupBallot;
      case OpGroupNonUniformInverseBallot:
      case OpGroupNonUniformBallotBitExtract:
        return SPVFuncImplSubgroupBallotBitExtract;
      case OpGroupNonUniformBallotBitCount:
        return SPVFuncImplSubgroupBallotBitCount;
      case OpGroupNonUniformBallotFindLSB:
        return SPVFuncImplSubgroupBallotFindLSB;
      case OpGroupNonUniformBallotFindMSB:
        return SPVFuncImplSubgroupBallotFindMSB;
      case OpGroupNonUniformShuffle:
        return SPVFuncImplSubgroupShuffle;
      case OpGroupNonUniformShuffleXor:
        return SPVFuncImplSubgroupShuffleXor;
      case OpGroupNonUniformShuffleUp:
        return SPVFuncImplSubgroupShuffleUp;
      case OpGroupNonUniformShuffleDown:
        return SPVFuncImplSubgroupShuffleDown;
      default:
        return SPVFuncImplNone;
      case OpGroupNonUniformQuadBroadcast:
        return SPVFuncImplQuadBroadcast;
      case OpGroupNonUniformQuadSwap:
        return SPVFuncImplQuadSwap;
      }
    }
    if ((int)opcode < 0x114e) {
      if (opcode == OpSubgroupBallotKHR) {
        return SPVFuncImplSubgroupBallot;
      }
      if (opcode != OpSubgroupFirstInvocationKHR) {
        return SPVFuncImplNone;
      }
      return SPVFuncImplSubgroupBroadcastFirst;
    }
    if (opcode == OpSubgroupAllEqualKHR) {
      return SPVFuncImplSubgroupAllEqual;
    }
    if (opcode == OpSubgroupReadInvocationKHR) {
      return SPVFuncImplSubgroupBroadcast;
    }
    if (opcode != OpAtomicFAddEXT) {
      return SPVFuncImplNone;
    }
  }
  iVar4 = ::std::
          _Hashtable<unsigned_int,_std::pair<const_unsigned_int,_unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::find(&(this->image_pointers)._M_h,args + (ulong)(opcode != OpAtomicStore) * 2);
  if (iVar4.super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>._M_cur !=
      (__node_type *)0x0) {
    pSVar5 = Variant::get<spirv_cross::SPIRVariable>
                       ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                        super_VectorView<spirv_cross::Variant>.ptr +
                        *(uint *)((long)iVar4.
                                        super__Node_iterator_base<std::pair<const_unsigned_int,_unsigned_int>,_false>
                                        ._M_cur + 0xc));
    uVar6 = (ulong)*(uint *)&(pSVar5->super_IVariant).field_0xc;
    if ((uVar6 != 0) &&
       (pSVar7 = Variant::get<spirv_cross::SPIRType>
                           ((this->compiler->super_CompilerGLSL).super_Compiler.ir.ids.
                            super_VectorView<spirv_cross::Variant>.ptr + uVar6),
       (pSVar7->image).dim == Dim2D)) {
      return SPVFuncImplImage2DAtomicCoords;
    }
  }
  return SPVFuncImplNone;
}

Assistant:

CompilerMSL::SPVFuncImpl CompilerMSL::OpCodePreprocessor::get_spv_func_impl(Op opcode, const uint32_t *args)
{
	switch (opcode)
	{
	case OpFMod:
		return SPVFuncImplMod;

	case OpFAdd:
	case OpFSub:
		if (compiler.msl_options.invariant_float_math ||
		    compiler.has_decoration(args[1], DecorationNoContraction))
		{
			return opcode == OpFAdd ? SPVFuncImplFAdd : SPVFuncImplFSub;
		}
		break;

	case OpFMul:
	case OpOuterProduct:
	case OpMatrixTimesVector:
	case OpVectorTimesMatrix:
	case OpMatrixTimesMatrix:
		if (compiler.msl_options.invariant_float_math ||
		    compiler.has_decoration(args[1], DecorationNoContraction))
		{
			return SPVFuncImplFMul;
		}
		break;

	case OpQuantizeToF16:
		return SPVFuncImplQuantizeToF16;

	case OpTypeArray:
	{
		// Allow Metal to use the array<T> template to make arrays a value type
		return SPVFuncImplUnsafeArray;
	}

	// Emulate texture2D atomic operations
	case OpAtomicExchange:
	case OpAtomicCompareExchange:
	case OpAtomicCompareExchangeWeak:
	case OpAtomicIIncrement:
	case OpAtomicIDecrement:
	case OpAtomicIAdd:
	case OpAtomicFAddEXT:
	case OpAtomicISub:
	case OpAtomicSMin:
	case OpAtomicUMin:
	case OpAtomicSMax:
	case OpAtomicUMax:
	case OpAtomicAnd:
	case OpAtomicOr:
	case OpAtomicXor:
	case OpAtomicLoad:
	case OpAtomicStore:
	{
		auto it = image_pointers.find(args[opcode == OpAtomicStore ? 0 : 2]);
		if (it != image_pointers.end())
		{
			uint32_t tid = compiler.get<SPIRVariable>(it->second).basetype;
			if (tid && compiler.get<SPIRType>(tid).image.dim == Dim2D)
				return SPVFuncImplImage2DAtomicCoords;
		}
		break;
	}

	case OpImageFetch:
	case OpImageRead:
	case OpImageWrite:
	{
		// Retrieve the image type, and if it's a Buffer, emit a texel coordinate function
		uint32_t tid = result_types[args[opcode == OpImageWrite ? 0 : 2]];
		if (tid && compiler.get<SPIRType>(tid).image.dim == DimBuffer && !compiler.msl_options.texture_buffer_native)
			return SPVFuncImplTexelBufferCoords;
		break;
	}

	case OpExtInst:
	{
		uint32_t extension_set = args[2];
		if (compiler.get<SPIRExtension>(extension_set).ext == SPIRExtension::GLSL)
		{
			auto op_450 = static_cast<GLSLstd450>(args[3]);
			switch (op_450)
			{
			case GLSLstd450Radians:
				return SPVFuncImplRadians;
			case GLSLstd450Degrees:
				return SPVFuncImplDegrees;
			case GLSLstd450FindILsb:
				return SPVFuncImplFindILsb;
			case GLSLstd450FindSMsb:
				return SPVFuncImplFindSMsb;
			case GLSLstd450FindUMsb:
				return SPVFuncImplFindUMsb;
			case GLSLstd450SSign:
				return SPVFuncImplSSign;
			case GLSLstd450Reflect:
			{
				auto &type = compiler.get<SPIRType>(args[0]);
				if (type.vecsize == 1)
					return SPVFuncImplReflectScalar;
				break;
			}
			case GLSLstd450Refract:
			{
				auto &type = compiler.get<SPIRType>(args[0]);
				if (type.vecsize == 1)
					return SPVFuncImplRefractScalar;
				break;
			}
			case GLSLstd450FaceForward:
			{
				auto &type = compiler.get<SPIRType>(args[0]);
				if (type.vecsize == 1)
					return SPVFuncImplFaceForwardScalar;
				break;
			}
			case GLSLstd450MatrixInverse:
			{
				auto &mat_type = compiler.get<SPIRType>(args[0]);
				switch (mat_type.columns)
				{
				case 2:
					return SPVFuncImplInverse2x2;
				case 3:
					return SPVFuncImplInverse3x3;
				case 4:
					return SPVFuncImplInverse4x4;
				default:
					break;
				}
				break;
			}
			default:
				break;
			}
		}
		break;
	}

	case OpGroupNonUniformBroadcast:
	case OpSubgroupReadInvocationKHR:
		return SPVFuncImplSubgroupBroadcast;

	case OpGroupNonUniformBroadcastFirst:
	case OpSubgroupFirstInvocationKHR:
		return SPVFuncImplSubgroupBroadcastFirst;

	case OpGroupNonUniformBallot:
	case OpSubgroupBallotKHR:
		return SPVFuncImplSubgroupBallot;

	case OpGroupNonUniformInverseBallot:
	case OpGroupNonUniformBallotBitExtract:
		return SPVFuncImplSubgroupBallotBitExtract;

	case OpGroupNonUniformBallotFindLSB:
		return SPVFuncImplSubgroupBallotFindLSB;

	case OpGroupNonUniformBallotFindMSB:
		return SPVFuncImplSubgroupBallotFindMSB;

	case OpGroupNonUniformBallotBitCount:
		return SPVFuncImplSubgroupBallotBitCount;

	case OpGroupNonUniformAllEqual:
	case OpSubgroupAllEqualKHR:
		return SPVFuncImplSubgroupAllEqual;

	case OpGroupNonUniformShuffle:
		return SPVFuncImplSubgroupShuffle;

	case OpGroupNonUniformShuffleXor:
		return SPVFuncImplSubgroupShuffleXor;

	case OpGroupNonUniformShuffleUp:
		return SPVFuncImplSubgroupShuffleUp;

	case OpGroupNonUniformShuffleDown:
		return SPVFuncImplSubgroupShuffleDown;

	case OpGroupNonUniformQuadBroadcast:
		return SPVFuncImplQuadBroadcast;

	case OpGroupNonUniformQuadSwap:
		return SPVFuncImplQuadSwap;

	default:
		break;
	}
	return SPVFuncImplNone;
}